

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool.cxx
# Opt level: O0

bool __thiscall
cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *needed)

{
  cmRuntimeDependencyArchive *this_00;
  pointer this_01;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  istream *piVar4;
  char *string;
  reference ppSVar5;
  string local_6a0;
  undefined1 local_680 [8];
  ostringstream e_2;
  undefined1 local_508 [8];
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  undefined1 local_4d0 [8];
  ostringstream e_1;
  string local_358;
  undefined1 local_338 [8];
  RegularExpressionMatch match;
  string line;
  undefined1 local_250 [8];
  ostringstream e;
  undefined1 local_d8 [8];
  cmUVProcessChain process;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  undefined1 local_58 [8];
  cmUVProcessChainBuilder builder;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *needed_local;
  string *file_local;
  cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool *this_local;
  
  builder.Processes.
  super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)needed;
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_58);
  cmUVProcessChainBuilder::SetBuiltinStream((cmUVProcessChainBuilder *)local_58,Stream_OUTPUT);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_80);
  this_00 = (this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool).Archive;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"dumpbin",&local_a1);
  bVar1 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,&local_a0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_80,
               (char (*) [12])"/dependents");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_80,file);
    cmUVProcessChainBuilder::AddCommand
              ((cmUVProcessChainBuilder *)local_58,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_80);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_d8);
    bVar1 = cmUVProcessChain::Valid((cmUVProcessChain *)local_d8);
    if (bVar1) {
      std::__cxx11::string::string((string *)&match.searchstring);
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::regex == '\0') &&
         (iVar2 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::regex), iVar2 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  (&GetFileInfo::regex,"^    ([^\n]*\\.[Dd][Ll][Ll])\r$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::regex,&__dso_handle)
        ;
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::regex);
      }
      while( true ) {
        piVar4 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_d8);
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (piVar4,(string *)&match.searchstring);
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        if (!bVar1) break;
        cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)local_338);
        string = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::RegularExpression::find
                          (&GetFileInfo::regex,string,(RegularExpressionMatch *)local_338);
        this_01 = builder.Processes.
                  super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (bVar1) {
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_358,(RegularExpressionMatch *)local_338,1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this_01->Arguments,&local_358);
          std::__cxx11::string::~string((string *)&local_358);
        }
      }
      bVar1 = cmUVProcessChain::Wait((cmUVProcessChain *)local_d8,-1);
      if (bVar1) {
        cmUVProcessChain::GetStatus
                  ((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                    *)local_508,(cmUVProcessChain *)local_d8);
        ppSVar5 = std::
                  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                  ::operator[]((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                                *)local_508,0);
        if ((*ppSVar5 == (value_type)0x0) ||
           (ppSVar5 = std::
                      vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                      ::operator[]((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                                    *)local_508,0), (*ppSVar5)->ExitStatus != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_680);
          poVar3 = std::operator<<((ostream *)local_680,"Failed to run dumpbin on:\n  ");
          std::operator<<(poVar3,(string *)file);
          std::__cxx11::ostringstream::str();
          cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
                    (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,&local_6a0);
          std::__cxx11::string::~string((string *)&local_6a0);
          this_local._7_1_ = false;
          process.Data._M_t.
          super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
          .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._0_4_ = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_680);
        }
        else {
          this_local._7_1_ = true;
          process.Data._M_t.
          super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
          .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._0_4_ = 1;
        }
        std::
        vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
        ::~vector((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                   *)local_508);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
        poVar3 = std::operator<<((ostream *)local_4d0,"Failed to wait on dumpbin process for:\n  ");
        std::operator<<(poVar3,(string *)file);
        std::__cxx11::ostringstream::str();
        cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
                  (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,
                   (string *)
                   &status.
                    super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &status.
                    super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        this_local._7_1_ = false;
        process.Data._M_t.
        super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
        .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._0_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
      }
      std::__cxx11::string::~string((string *)&match.searchstring);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
      poVar3 = std::operator<<((ostream *)local_250,"Failed to start dumpbin process for:\n  ");
      std::operator<<(poVar3,(string *)file);
      std::__cxx11::ostringstream::str();
      cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
                (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,
                 (string *)((long)&line.field_2 + 8));
      std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
      this_local._7_1_ = false;
      process.Data._M_t.
      super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
      .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._0_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
    }
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_d8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Could not find dumpbin",
               (allocator<char> *)
               ((long)&process.Data._M_t.
                       super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                       .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 7));
    cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&process.Data._M_t.
                       super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                       .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 7));
    this_local._7_1_ = false;
    process.Data._M_t.
    super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
    .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._0_4_ = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_80);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_58);
  return this_local._7_1_;
}

Assistant:

bool cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool::GetFileInfo(
  const std::string& file, std::vector<std::string>& needed)
{
  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT);

  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("dumpbin", command)) {
    this->SetError("Could not find dumpbin");
    return false;
  }
  command.emplace_back("/dependents");
  command.push_back(file);
  builder.AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid()) {
    std::ostringstream e;
    e << "Failed to start dumpbin process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex(
    "^    ([^\n]*\\.[Dd][Ll][Ll])\r$");
  while (std::getline(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      needed.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on dumpbin process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run dumpbin on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}